

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_AddDeleteTest_Test::TestBody
          (ComparisonTest_AddDeleteTest_Test *this)

{
  byte *pbVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string local_28;
  
  (this->super_ComparisonTest).proto1_.field_0._impl_.optional_int32_ = 0;
  pbVar1 = (byte *)((long)&(this->super_ComparisonTest).proto1_.field_0 + 1);
  *pbVar1 = *pbVar1 & 0xef;
  (this->super_ComparisonTest).proto2_.field_0._impl_.optional_int64_ = 0;
  pbVar1 = (byte *)((long)&(this->super_ComparisonTest).proto2_.field_0 + 1);
  *pbVar1 = *pbVar1 & 0xf7;
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_28,this,&(this->super_ComparisonTest).proto1_.super_Message,
             &(this->super_ComparisonTest).proto2_.super_Message);
  testing::internal::CmpHelperEQ<char[57],std::__cxx11::string>
            (local_38,"\"added: optional_int32: 101\\n\" \"deleted: optional_int64: 102\\n\"",
             "Run()",(char (*) [57])"added: optional_int32: 101\ndeleted: optional_int64: 102\n",
             &local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xdb9,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_28._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, AddDeleteTest) {
  proto1_.clear_optional_int32();
  proto2_.clear_optional_int64();

  EXPECT_EQ(
      "added: optional_int32: 101\n"
      "deleted: optional_int64: 102\n",
      Run());
}